

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

ExpressionSyntax * __thiscall
slang::parsing::Parser::parseNewExpression
          (Parser *this,NameSyntax *newKeyword,
          bitmask<slang::parsing::detail::ExpressionOptions> options)

{
  Token closeParen;
  SourceRange range;
  Token defaultKeyword_00;
  SourceRange range_00;
  Token openParen_00;
  Token openBracket_00;
  Token openParen_01;
  SourceRange range_01;
  Token closeBracket_00;
  Token closeParen_00;
  string_view arg;
  bool bVar1;
  NameSyntax *pNVar2;
  Diagnostic *this_00;
  SyntaxNode *in_RSI;
  long in_RDI;
  Token TVar3;
  SuperNewDefaultedArgsExpressionSyntax *result;
  Token defaultKeyword;
  Token openParen_1;
  ScopedNameSyntax *scoped;
  bool isSuperNew;
  ExpressionSyntax *initializerExpr;
  Token openParen;
  ParenthesizedExpressionSyntax *initializer;
  Token closeBracket;
  ExpressionSyntax *sizeExpr;
  Token openBracket;
  TokenKind kind;
  ParserBase *in_stack_fffffffffffffda8;
  Parser *in_stack_fffffffffffffdb0;
  undefined6 in_stack_fffffffffffffdb8;
  TokenKind in_stack_fffffffffffffdbe;
  SourceLocation in_stack_fffffffffffffdc0;
  ParserBase *in_stack_fffffffffffffdc8;
  SourceLocation in_stack_fffffffffffffdd0;
  SourceLocation in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  DiagCode in_stack_fffffffffffffde4;
  Info *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  undefined1 uVar4;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  SourceLocation in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  DiagCode code;
  undefined1 in_stack_fffffffffffffe30 [16];
  TokenKind kind_00;
  ParserBase *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  NameSyntax *local_178;
  Info *local_170;
  TokenKind local_120;
  Token local_100;
  SourceLocation local_f0;
  undefined4 local_e8;
  bitmask<slang::parsing::detail::ExpressionOptions> local_e4;
  Token local_e0;
  ScopedNameSyntax *local_d0;
  byte local_c1;
  ParenthesizedExpressionSyntax *local_c0;
  Info *local_b8;
  undefined8 local_b0;
  Info *local_a8;
  Token local_a0;
  undefined8 local_90;
  Info *local_88;
  ExpressionSyntax *local_80;
  Token local_78;
  ParenthesizedExpressionSyntax *local_68;
  Token local_60;
  ExpressionSyntax *local_50;
  Token local_48;
  Token local_38;
  TokenKind local_22;
  SyntaxNode *local_20;
  NewArrayExpressionSyntax *local_8;
  
  kind_00 = in_stack_fffffffffffffe30._14_2_;
  code = SUB84((ulong)in_stack_fffffffffffffe20 >> 0x20,0);
  local_20 = in_RSI;
  local_38 = ParserBase::peek(in_stack_fffffffffffffda8);
  local_22 = local_38.kind;
  if (local_38.kind == OpenBracket) {
    local_48 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffdd0);
    local_50 = parseExpression(in_stack_fffffffffffffdb0);
    local_60 = ParserBase::expect(in_stack_fffffffffffffe40,kind_00);
    local_68 = (ParenthesizedExpressionSyntax *)0x0;
    bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbe);
    if (bVar1) {
      local_78 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffdd0);
      local_80 = parseExpression(in_stack_fffffffffffffdb0);
      TVar3 = local_78;
      local_90._0_2_ = local_78.kind;
      local_90._2_1_ = local_78._2_1_;
      local_90._3_1_ = local_78.numFlags.raw;
      local_90._4_4_ = local_78.rawLen;
      local_78.info = TVar3.info;
      local_88 = local_78.info;
      local_78 = TVar3;
      local_a0 = ParserBase::expect(in_stack_fffffffffffffe40,kind_00);
      openParen_00.info = (Info *)in_stack_fffffffffffffdd0;
      openParen_00._0_8_ = in_stack_fffffffffffffdc8;
      closeParen.rawLen._2_2_ = in_stack_fffffffffffffdbe;
      closeParen._0_6_ = in_stack_fffffffffffffdb8;
      closeParen.info = (Info *)in_stack_fffffffffffffdc0;
      local_68 = slang::syntax::SyntaxFactory::parenthesizedExpression
                           ((SyntaxFactory *)in_stack_fffffffffffffdb0,openParen_00,
                            (ExpressionSyntax *)in_stack_fffffffffffffda8,closeParen);
    }
    TVar3 = local_48;
    local_b0._0_2_ = local_48.kind;
    local_b0._2_1_ = local_48._2_1_;
    local_b0._3_1_ = local_48.numFlags.raw;
    local_b0._4_4_ = local_48.rawLen;
    local_48.info = TVar3.info;
    local_a8 = local_48.info;
    local_c0 = (ParenthesizedExpressionSyntax *)local_60._0_8_;
    local_b8 = local_60.info;
    openBracket_00.info = (Info *)in_stack_fffffffffffffdd0;
    openBracket_00._0_8_ = in_stack_fffffffffffffdc8;
    closeBracket_00.rawLen._0_2_ = in_stack_fffffffffffffde4.subsystem;
    closeBracket_00.rawLen._2_2_ = in_stack_fffffffffffffde4.code;
    closeBracket_00.kind = (short)in_stack_fffffffffffffde0;
    closeBracket_00._2_1_ = (char)((uint)in_stack_fffffffffffffde0 >> 0x10);
    closeBracket_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffde0 >> 0x18);
    closeBracket_00.info = in_stack_fffffffffffffde8;
    local_48 = TVar3;
    local_8 = slang::syntax::SyntaxFactory::newArrayExpression
                        ((SyntaxFactory *)in_stack_fffffffffffffdc0,
                         (NameSyntax *)CONCAT26(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)
                         ,openBracket_00,(ExpressionSyntax *)local_60.info,closeBracket_00,
                         (ParenthesizedExpressionSyntax *)local_60._0_8_);
  }
  else {
    local_c1 = 0;
    if (local_20->kind == ScopedName) {
      local_d0 = slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>(local_20);
      pNVar2 = not_null<slang::syntax::NameSyntax_*>::operator->
                         ((not_null<slang::syntax::NameSyntax_*> *)0xa1dd26);
      in_stack_fffffffffffffe17 = false;
      if ((pNVar2->super_ExpressionSyntax).super_SyntaxNode.kind == ConstructorName) {
        not_null<slang::syntax::NameSyntax_*>::operator->
                  ((not_null<slang::syntax::NameSyntax_*> *)0xa1dd45);
        local_e0 = slang::syntax::SyntaxNode::getLastToken
                             ((SyntaxNode *)
                              CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
        in_stack_fffffffffffffe17 = local_e0.kind == SuperKeyword;
      }
      if ((bool)in_stack_fffffffffffffe17 != false) {
        local_c1 = 1;
        bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(&local_e4,AllowSuperNewCall);
        bVar1 = bitmask<slang::parsing::detail::ExpressionOptions>::has
                          ((bitmask<slang::parsing::detail::ExpressionOptions> *)
                           in_stack_fffffffffffffdb0,
                           (bitmask<slang::parsing::detail::ExpressionOptions> *)
                           in_stack_fffffffffffffda8);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          local_e8 = 0x7a0005;
          not_null<slang::syntax::NameSyntax_*>::operator->
                    ((not_null<slang::syntax::NameSyntax_*> *)0xa1ddd3);
          local_100 = slang::syntax::SyntaxNode::getFirstToken
                                ((SyntaxNode *)
                                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
          local_f0 = Token::location(&local_100);
          ParserBase::addDiag((ParserBase *)
                              CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),code,
                              in_stack_fffffffffffffe18);
          slang::syntax::SyntaxNode::sourceRange
                    ((SyntaxNode *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
          range.startLoc._6_2_ = in_stack_fffffffffffffdbe;
          range.startLoc._0_6_ = in_stack_fffffffffffffdb8;
          range.endLoc = in_stack_fffffffffffffdc0;
          Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffdb0,range);
        }
      }
    }
    if (local_22 == OpenParenthesis) {
      uVar4 = false;
      if ((local_c1 & 1) != 0) {
        TVar3 = ParserBase::peek((ParserBase *)
                                 CONCAT26(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8),
                                 (uint32_t)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
        local_120 = TVar3.kind;
        uVar4 = local_120 == DefaultKeyword;
      }
      if ((bool)uVar4 == false) {
        parseArgumentList((Parser *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
        local_8 = (NewArrayExpressionSyntax *)
                  slang::syntax::SyntaxFactory::newClassExpression
                            ((SyntaxFactory *)in_stack_fffffffffffffdb0,
                             (NameSyntax *)in_stack_fffffffffffffda8,(ArgumentListSyntax *)0xa1e0bb)
        ;
      }
      else {
        ParserBase::consume((ParserBase *)in_stack_fffffffffffffdd0);
        ParserBase::consume((ParserBase *)in_stack_fffffffffffffdd0);
        this_00 = (Diagnostic *)(in_RDI + 0xe0);
        TVar3 = ParserBase::expect(in_stack_fffffffffffffe40,kind_00);
        local_178 = TVar3._0_8_;
        local_170 = TVar3.info;
        openParen_01.info = (Info *)in_stack_fffffffffffffdd0;
        openParen_01._0_8_ = in_stack_fffffffffffffdc8;
        defaultKeyword_00.rawLen._2_2_ = in_stack_fffffffffffffdbe;
        defaultKeyword_00._0_6_ = in_stack_fffffffffffffdb8;
        defaultKeyword_00.info = (Info *)in_stack_fffffffffffffdc0;
        closeParen_00.rawLen._0_2_ = in_stack_fffffffffffffde4.subsystem;
        closeParen_00.rawLen._2_2_ = in_stack_fffffffffffffde4.code;
        closeParen_00.kind = (short)in_stack_fffffffffffffde0;
        closeParen_00._2_1_ = (char)((uint)in_stack_fffffffffffffde0 >> 0x10);
        closeParen_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffde0 >> 0x18);
        closeParen_00.info = in_stack_fffffffffffffde8;
        local_8 = (NewArrayExpressionSyntax *)
                  slang::syntax::SyntaxFactory::superNewDefaultedArgsExpression
                            ((SyntaxFactory *)local_170,local_178,openParen_01,defaultKeyword_00,
                             closeParen_00);
        if (*(int *)(in_RDI + 0xf4) < 1) {
          slang::syntax::SyntaxNode::sourceRange
                    ((SyntaxNode *)CONCAT17(uVar4,in_stack_fffffffffffffe00));
          range_01.endLoc = in_stack_fffffffffffffdd8;
          range_01.startLoc = in_stack_fffffffffffffdd0;
          ParserBase::addDiag(in_stack_fffffffffffffdc8,in_stack_fffffffffffffde4,range_01);
          slang::toString(Default);
          arg._M_str._0_7_ = in_stack_fffffffffffffe00;
          arg._M_len = (size_t)local_20;
          arg._M_str._7_1_ = uVar4;
          Diagnostic::operator<<(this_00,arg);
        }
      }
    }
    else {
      bVar1 = slang::syntax::SyntaxFacts::isPossibleExpression
                        ((TokenKind)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      if (bVar1) {
        if (local_20->kind != ConstructorName) {
          ParserBase::peek(in_stack_fffffffffffffda8);
          Token::location((Token *)&stack0xfffffffffffffe40);
          ParserBase::addDiag((ParserBase *)
                              CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),code,
                              in_stack_fffffffffffffe18);
          slang::syntax::SyntaxNode::sourceRange
                    ((SyntaxNode *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
          range_00.startLoc._6_2_ = in_stack_fffffffffffffdbe;
          range_00.startLoc._0_6_ = in_stack_fffffffffffffdb8;
          range_00.endLoc = in_stack_fffffffffffffdc0;
          Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffdb0,range_00);
        }
        parseExpression(in_stack_fffffffffffffdb0);
        local_8 = (NewArrayExpressionSyntax *)
                  slang::syntax::SyntaxFactory::copyClassExpression
                            ((SyntaxFactory *)in_stack_fffffffffffffdb0,
                             (NameSyntax *)in_stack_fffffffffffffda8,(ExpressionSyntax *)0xa1e1c0);
      }
      else {
        local_8 = (NewArrayExpressionSyntax *)
                  slang::syntax::SyntaxFactory::newClassExpression
                            ((SyntaxFactory *)in_stack_fffffffffffffdb0,
                             (NameSyntax *)in_stack_fffffffffffffda8,(ArgumentListSyntax *)0xa1e1ea)
        ;
      }
    }
  }
  return &local_8->super_ExpressionSyntax;
}

Assistant:

ExpressionSyntax& Parser::parseNewExpression(NameSyntax& newKeyword,
                                             bitmask<ExpressionOptions> options) {
    // If we see an open bracket, this is a dynamic array new expression.
    auto kind = peek().kind;
    if (kind == TokenKind::OpenBracket) {
        auto openBracket = consume();
        auto& sizeExpr = parseExpression();
        auto closeBracket = expect(TokenKind::CloseBracket);

        ParenthesizedExpressionSyntax* initializer = nullptr;
        if (peek(TokenKind::OpenParenthesis)) {
            auto openParen = consume();
            auto& initializerExpr = parseExpression();
            initializer = &factory.parenthesizedExpression(openParen, initializerExpr,
                                                           expect(TokenKind::CloseParenthesis));
        }
        return factory.newArrayExpression(newKeyword, openBracket, sizeExpr, closeBracket,
                                          initializer);
    }

    // Enforce rules for super.new placement.
    bool isSuperNew = false;
    if (newKeyword.kind == SyntaxKind::ScopedName) {
        auto& scoped = newKeyword.as<ScopedNameSyntax>();
        if (scoped.right->kind == SyntaxKind::ConstructorName &&
            scoped.left->getLastToken().kind == TokenKind::SuperKeyword) {
            isSuperNew = true;
            if (!options.has(ExpressionOptions::AllowSuperNewCall)) {
                addDiag(diag::InvalidSuperNew, scoped.right->getFirstToken().location())
                    << newKeyword.sourceRange();
            }
        }
    }

    // Otherwise this is a new-class or copy-class expression.
    // new-class has an optional argument list, copy-class has a required expression.
    // An open paren here would be ambiguous between an arg list and a parenthesized
    // expression -- we resolve by always taking the arg list.
    if (kind == TokenKind::OpenParenthesis) {
        // 1800-2023 added the construct super.new(default) -- check for that here.
        if (isSuperNew && peek(1).kind == TokenKind::DefaultKeyword) {
            auto openParen = consume();
            auto defaultKeyword = consume();
            auto& result = factory.superNewDefaultedArgsExpression(
                newKeyword, openParen, defaultKeyword, expect(TokenKind::CloseParenthesis));

            if (parseOptions.languageVersion < LanguageVersion::v1800_2023) {
                addDiag(diag::WrongLanguageVersion, result.sourceRange())
                    << toString(parseOptions.languageVersion);
            }

            return result;
        }
        return factory.newClassExpression(newKeyword, &parseArgumentList());
    }

    if (isPossibleExpression(kind)) {
        if (newKeyword.kind != SyntaxKind::ConstructorName)
            addDiag(diag::ScopedClassCopy, peek().location()) << newKeyword.sourceRange();
        return factory.copyClassExpression(newKeyword, parseExpression());
    }

    return factory.newClassExpression(newKeyword, nullptr);
}